

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O3

int32_t __thiscall date_parse_result::dayno(date_parse_result *this)

{
  int32_t iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  caldate_t cd;
  caldate_t local_14;
  
  local_14.y = this->yy;
  iVar4 = local_14.y + -1;
  iVar2 = local_14.y + 2;
  if (-1 < iVar4) {
    iVar2 = iVar4;
  }
  iVar3 = (int)((ulong)((long)iVar4 * -0x51eb851f) >> 0x20);
  iVar2 = (iVar2 >> 2) + local_14.y + ((iVar3 >> 5) - (iVar3 >> 0x1f));
  iVar3 = iVar2 + iVar4 / 400;
  iVar4 = (int)((ulong)((long)(iVar2 + iVar4 / 400 + 3) * -0x6db6db6d) >> 0x20) + iVar3 + 3;
  iVar4 = ((iVar4 >> 2) - (iVar4 >> 0x1f)) * -7;
  local_14.d = 10;
  if (iVar4 + iVar3 != -3) {
    local_14.d = iVar4 + 6 + iVar3;
  }
  local_14.d = this->w - local_14.d;
  local_14.m = 1;
  iVar1 = caldate_t::dayno(&local_14);
  return iVar1;
}

Assistant:

int32_t dayno() const
    {
        /* if there's an ISO weekday, convert it to a calendar date */
        if (has_iso_week() && has_year())
        {
            /* 
             *   Calculate the "correction factor" - this is the ISO weekday
             *   number of January 4 of the year, plus 3.  Note that this is
             *   explicitly defined as Jan 4 *Gregorian* by the standard, so
             *   this isn't relative to the calendar we're parsing for.
             */
            caldate_t jan4(yy, 1, 4);
            int corr = jan4.iso_weekday() + 3;

            /* 
             *   Set the date to "January 'ord'", where 'ord' is the ISO
             *   ordinal day number calculated from the weekday and
             *   correction factor.  This won't necessarily be a valid date
             *   in January, but caldate_t handles overflows in the day by
             *   carrying into the month and year as needed.
             */
            caldate_t cd(yy, 1, w - corr);
            return cd.dayno();
        }
        else
        {
            /* set the calendar date to our year, month, and day */
            cal->set_date(yy, mm, dd);

            /* return the day number from the calendar date */
            return cal->dayno();
        }
    }